

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O1

void __thiscall
Am_Style_Data::Am_Style_Data
          (Am_Style_Data *this,char *cname,short thickness,Am_Line_Cap_Style_Flag cap,
          Am_Join_Style_Flag join,Am_Line_Solid_Flag line_flag,char *dash_l,int dash_l_length,
          Am_Fill_Solid_Flag fill_flag,Am_Fill_Poly_Flag poly,Am_Image_Array *stipple)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e46d0;
  this->main_display = (Display *)0x0;
  this->color_head = (Color_Index *)0x0;
  this->color_allocated = true;
  this->line_thickness = thickness;
  this->cap_style = cap;
  this->join_style = join;
  this->line_solid = line_flag;
  this->dash_list_length = dash_l_length;
  this->fill_solid = fill_flag;
  this->fill_poly = poly;
  Am_Image_Array::Am_Image_Array(&this->stipple_bitmap,stipple);
  iVar1 = this->dash_list_length;
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  pcVar3 = (char *)operator_new__((long)iVar2);
  this->dash_list = pcVar3;
  memcpy(pcVar3,dash_l,(long)iVar1);
  sVar4 = strlen(cname);
  pcVar3 = (char *)operator_new__(sVar4 + 1);
  strcpy(pcVar3,cname);
  this->color_name = pcVar3;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Style_Data::Am_Style_Data(const char *cname, short thickness,
                             Am_Line_Cap_Style_Flag cap,
                             Am_Join_Style_Flag join,
                             Am_Line_Solid_Flag line_flag, const char *dash_l,
                             int dash_l_length, Am_Fill_Solid_Flag fill_flag,
                             Am_Fill_Poly_Flag poly, Am_Image_Array stipple)
    : main_display(nullptr), color_head(nullptr), color_allocated(true),
      line_thickness(thickness), cap_style(cap), join_style(join),
      line_solid(line_flag), dash_list_length(dash_l_length),
      fill_solid(fill_flag), fill_poly(poly), stipple_bitmap(stipple)
{
  dash_list = new char[dash_list_length];
  memcpy(dash_list, dash_l, dash_list_length);

  char *color_hold = new char[strlen(cname) + 1];
  strcpy(color_hold, cname);
  color_name = color_hold;

  next = list;
  list = this;
#ifdef DEBUG
  Am_Register_Name(this, cname);
#endif
}